

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_run_completed(uv_udp_t *handle)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  uv__queue *puVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  
  if ((handle->flags >> 0x18 & 1) != 0) {
    __assert_fail("!(handle->flags & UV_HANDLE_UDP_PROCESSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x5f,"void uv__udp_run_completed(uv_udp_t *)");
  }
  handle->flags = handle->flags | 0x1000000;
  puVar4 = (handle->write_completed_queue).next;
  while( true ) {
    if (puVar4 == &handle->write_completed_queue) {
      if ((handle->write_queue).next == &handle->write_queue) {
        uv__io_stop(handle->loop,&handle->io_watcher,4);
        iVar5 = uv__io_active(&handle->io_watcher,1);
        if (((iVar5 == 0) && (uVar3 = handle->flags, (uVar3 & 4) != 0)) &&
           (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 - 1;
        }
      }
      pbVar2 = (byte *)((long)&handle->flags + 3);
      *pbVar2 = *pbVar2 & 0xfe;
      return;
    }
    puVar4->prev->next = puVar4->next;
    puVar4->next->prev = puVar4->prev;
    uVar3 = (handle->loop->active_reqs).count;
    if (uVar3 == 0) break;
    (handle->loop->active_reqs).count = uVar3 - 1;
    sVar6 = uv__count_bufs((uv_buf_t *)puVar4[9].prev,*(uint *)&puVar4[9].next);
    handle->send_queue_size = handle->send_queue_size - sVar6;
    handle->send_queue_count = handle->send_queue_count - 1;
    if (puVar4[9].prev != puVar4 + 0xb) {
      uv__free(puVar4[9].prev);
    }
    puVar4[9].prev = (uv__queue *)0x0;
    if (puVar4[10].prev != (uv__queue *)0x0) {
      uVar7 = (ulong)puVar4[10].next & 0xffffffff;
      if (-1 < (long)puVar4[10].next) {
        uVar7 = 0;
      }
      (*(code *)puVar4[10].prev)(&puVar4[-6].prev,uVar7);
    }
    puVar4 = (handle->write_completed_queue).next;
  }
  __assert_fail("uv__has_active_reqs(handle->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                ,0x67,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__queue* q;

  assert(!(handle->flags & UV_HANDLE_UDP_PROCESSING));
  handle->flags |= UV_HANDLE_UDP_PROCESSING;

  while (!uv__queue_empty(&handle->write_completed_queue)) {
    q = uv__queue_head(&handle->write_completed_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (uv__queue_empty(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_HANDLE_UDP_PROCESSING;
}